

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

_Bool sysbvm_astNode_isMacroExpression(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  _Bool _Var1;
  sysbvm_tuple_t function;
  sysbvm_tuple_t tuple_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_astNode_isLiteralNode(context,tuple);
  if (_Var1) {
    function = sysbvm_astLiteralNode_getValue(tuple);
    context_local._7_1_ = sysbvm_function_isMacro(context,function);
  }
  else {
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_astNode_isMacroExpression(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    if(sysbvm_astNode_isLiteralNode(context, tuple))
        return sysbvm_function_isMacro(context, sysbvm_astLiteralNode_getValue(tuple));

    return false;
}